

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-oob.c
# Opt level: O2

int run_test_tcp_oob(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_20;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(puVar2,&server_handle);
    if (iVar1 == 0) {
      iVar1 = uv_tcp_init(puVar2,&client_handle);
      if (iVar1 == 0) {
        iVar1 = uv_tcp_init(puVar2,&peer_handle);
        if (iVar1 == 0) {
          iVar1 = uv_idle_init(puVar2,&idle);
          if (iVar1 == 0) {
            iVar1 = uv_tcp_bind(&server_handle,(sockaddr *)&addr,0);
            if (iVar1 == 0) {
              iVar1 = uv_listen((uv_stream_t *)&server_handle,1,connection_cb);
              if (iVar1 == 0) {
                iVar1 = uv_tcp_nodelay(&client_handle,1);
                if (iVar1 == 0) {
                  iVar1 = uv_tcp_connect(&connect_req,&client_handle,(sockaddr *)&addr,connect_cb);
                  if (iVar1 == 0) {
                    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
                    if (iVar1 == 0) {
                      if (ticks == 10) {
                        puVar2 = uv_default_loop();
                        uv_walk(puVar2,close_walk_cb,(void *)0x0);
                        uv_run(puVar2,UV_RUN_DEFAULT);
                        puVar2 = uv_default_loop();
                        iVar1 = uv_loop_close(puVar2);
                        if (iVar1 == 0) {
                          return 0;
                        }
                        pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                        uStack_20 = 0x8a;
                      }
                      else {
                        pcVar3 = "ticks == kMaxTicks";
                        uStack_20 = 0x88;
                      }
                    }
                    else {
                      pcVar3 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
                      uStack_20 = 0x86;
                    }
                  }
                  else {
                    pcVar3 = 
                    "0 == uv_tcp_connect(&connect_req, &client_handle, (const struct sockaddr*) &addr, connect_cb)"
                    ;
                    uStack_20 = 0x85;
                  }
                }
                else {
                  pcVar3 = "0 == uv_tcp_nodelay(&client_handle, 1)";
                  uStack_20 = 0x80;
                }
              }
              else {
                pcVar3 = "0 == uv_listen((uv_stream_t*) &server_handle, 1, connection_cb)";
                uStack_20 = 0x7d;
              }
            }
            else {
              pcVar3 = "0 == uv_tcp_bind(&server_handle, (const struct sockaddr*) &addr, 0)";
              uStack_20 = 0x7c;
            }
          }
          else {
            pcVar3 = "0 == uv_idle_init(loop, &idle)";
            uStack_20 = 0x7b;
          }
        }
        else {
          pcVar3 = "0 == uv_tcp_init(loop, &peer_handle)";
          uStack_20 = 0x7a;
        }
      }
      else {
        pcVar3 = "0 == uv_tcp_init(loop, &client_handle)";
        uStack_20 = 0x79;
      }
    }
    else {
      pcVar3 = "0 == uv_tcp_init(loop, &server_handle)";
      uStack_20 = 0x78;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
    uStack_20 = 0x75;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-oob.c"
          ,uStack_20,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(tcp_oob) {
  struct sockaddr_in addr;
  uv_loop_t* loop;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  loop = uv_default_loop();

  ASSERT(0 == uv_tcp_init(loop, &server_handle));
  ASSERT(0 == uv_tcp_init(loop, &client_handle));
  ASSERT(0 == uv_tcp_init(loop, &peer_handle));
  ASSERT(0 == uv_idle_init(loop, &idle));
  ASSERT(0 == uv_tcp_bind(&server_handle, (const struct sockaddr*) &addr, 0));
  ASSERT(0 == uv_listen((uv_stream_t*) &server_handle, 1, connection_cb));

  /* Ensure two separate packets */
  ASSERT(0 == uv_tcp_nodelay(&client_handle, 1));

  ASSERT(0 == uv_tcp_connect(&connect_req,
                             &client_handle,
                             (const struct sockaddr*) &addr,
                             connect_cb));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  ASSERT(ticks == kMaxTicks);

  MAKE_VALGRIND_HAPPY();
  return 0;
}